

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cxx
# Opt level: O2

ptr<buffer> __thiscall nuraft::buffer::alloc(buffer *this,size_t size)

{
  uint *puVar1;
  undefined2 *puVar2;
  int iVar3;
  buffer *pbVar4;
  stat_mgr *psVar5;
  stat_elem *psVar6;
  out_of_range *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  ptr<buffer> pVar8;
  allocator local_39;
  string local_38;
  
  if (alloc(unsigned_long)::num_allocs == '\0') {
    iVar3 = __cxa_guard_acquire(&alloc(unsigned_long)::num_allocs);
    if (iVar3 != 0) {
      psVar5 = stat_mgr::get_instance();
      std::__cxx11::string::string((string *)&local_38,"num_buffer_allocs",&local_39);
      psVar6 = stat_mgr::create_stat(psVar5,COUNTER,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      alloc::num_allocs = psVar6;
      __cxa_guard_release(&alloc(unsigned_long)::num_allocs);
    }
  }
  if (alloc(unsigned_long)::amount_allocs == '\0') {
    iVar3 = __cxa_guard_acquire(&alloc(unsigned_long)::amount_allocs);
    if (iVar3 != 0) {
      psVar5 = stat_mgr::get_instance();
      std::__cxx11::string::string((string *)&local_38,"amount_buffer_allocs",&local_39);
      psVar6 = stat_mgr::create_stat(psVar5,COUNTER,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      alloc::amount_allocs = psVar6;
      __cxa_guard_release(&alloc(unsigned_long)::amount_allocs);
    }
  }
  if (alloc(unsigned_long)::num_active == '\0') {
    iVar3 = __cxa_guard_acquire(&alloc(unsigned_long)::num_active);
    if (iVar3 != 0) {
      psVar5 = stat_mgr::get_instance();
      std::__cxx11::string::string((string *)&local_38,"num_active_buffers",&local_39);
      psVar6 = stat_mgr::create_stat(psVar5,COUNTER,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      alloc::num_active = psVar6;
      __cxa_guard_release(&alloc(unsigned_long)::num_active);
    }
  }
  if (alloc(unsigned_long)::amount_active == '\0') {
    iVar3 = __cxa_guard_acquire(&alloc(unsigned_long)::amount_active);
    if (iVar3 != 0) {
      psVar5 = stat_mgr::get_instance();
      std::__cxx11::string::string((string *)&local_38,"amount_active_buffers",&local_39);
      psVar6 = stat_mgr::create_stat(psVar5,COUNTER,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      alloc::amount_active = psVar6;
      __cxa_guard_release(&alloc(unsigned_long)::amount_active);
    }
  }
  if (size >> 0x1f == 0) {
    if (size < 0x8000) {
      pbVar4 = (buffer *)operator_new__(size + 4);
      std::__shared_ptr<nuraft::buffer,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<nuraft::buffer,void(*)(nuraft::buffer*),void>
                ((__shared_ptr<nuraft::buffer,(__gnu_cxx::_Lock_policy)2> *)this,pbVar4,free_buffer)
      ;
      puVar2 = *(undefined2 **)this;
      *puVar2 = (short)size;
      puVar2[1] = 0;
      _Var7._M_pi = extraout_RDX_00;
    }
    else {
      pbVar4 = (buffer *)operator_new__(size + 8);
      std::__shared_ptr<nuraft::buffer,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<nuraft::buffer,void(*)(nuraft::buffer*),void>
                ((__shared_ptr<nuraft::buffer,(__gnu_cxx::_Lock_policy)2> *)this,pbVar4,free_buffer)
      ;
      puVar1 = *(uint **)this;
      puVar1[1] = 0;
      *puVar1 = (uint)size | 0x80000000;
      _Var7._M_pi = extraout_RDX;
    }
    pVar8.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var7._M_pi;
    pVar8.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
    return (ptr<buffer>)pVar8.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range
            (this_00,"size exceed the max size that nuraft::buffer could support");
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

ptr<buffer> buffer::alloc(const size_t size) {
    static stat_elem& num_allocs = *stat_mgr::get_instance()->create_stat
        (stat_elem::COUNTER, "num_buffer_allocs");
    static stat_elem& amount_allocs = *stat_mgr::get_instance()->create_stat
        (stat_elem::COUNTER, "amount_buffer_allocs");
    static stat_elem& num_active = *stat_mgr::get_instance()->create_stat
        (stat_elem::COUNTER, "num_active_buffers");
    static stat_elem& amount_active = *stat_mgr::get_instance()->create_stat
        (stat_elem::COUNTER, "amount_active_buffers");

    if (size >= 0x80000000) {
        throw std::out_of_range( "size exceed the max size that "
                                 "nuraft::buffer could support" );
    }
    num_allocs++;
    num_active++;

    if (size >= 0x8000) {
        size_t len = size + sizeof(uint) * 2;
        ptr<buffer> buf( reinterpret_cast<buffer*>(new char[len]),
                         &free_buffer );
        amount_allocs += len;
        amount_active += len;

        any_ptr ptr = reinterpret_cast<any_ptr>( buf.get() );
        __init_b_block(ptr, size);
        return buf;
    }

    size_t len = size + sizeof(ushort) * 2;
    ptr<buffer> buf( reinterpret_cast<buffer*>(new char[len]),
                     &free_buffer );
    amount_allocs += len;
    amount_active += len;

    any_ptr ptr = reinterpret_cast<any_ptr>( buf.get() );
    __init_s_block(ptr, size);

    return buf;
}